

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

void bn_reverse(uchar *s,int len)

{
  uchar uVar1;
  uchar t;
  int iy;
  int ix;
  int len_local;
  uchar *s_local;
  
  iy = len + -1;
  for (ix = 0; ix < iy; ix = ix + 1) {
    uVar1 = s[ix];
    s[ix] = s[iy];
    s[iy] = uVar1;
    iy = iy + -1;
  }
  return;
}

Assistant:

void bn_reverse (unsigned char *s, int len)
{
  int     ix, iy;
  unsigned char t;

  ix = 0;
  iy = len - 1;
  while (ix < iy) {
    t     = s[ix];
    s[ix] = s[iy];
    s[iy] = t;
    ++ix;
    --iy;
  }
}